

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O2

void __thiscall ProfileHandler::GetState(ProfileHandler *this,ProfileHandlerState *state)

{
  undefined1 local_a8 [8];
  ScopedSignalBlocker block;
  SpinLockHolder sl;
  SpinLockHolder cl;
  
  sl.lock_ = &this->control_lock_;
  SpinLock::Lock(sl.lock_);
  ScopedSignalBlocker::ScopedSignalBlocker((ScopedSignalBlocker *)local_a8,this->signal_number_);
  block.sig_set_.__val[0xf] = (unsigned_long)&this->signal_lock_;
  SpinLock::Lock((SpinLock *)block.sig_set_.__val[0xf]);
  state->interrupts = this->interrupts_;
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)(block.sig_set_.__val + 0xf));
  ScopedSignalBlocker::~ScopedSignalBlocker((ScopedSignalBlocker *)local_a8);
  state->frequency = this->frequency_;
  state->callback_count = this->callback_count_;
  state->allowed = this->allowed_;
  SpinLockHolder::~SpinLockHolder(&sl);
  return;
}

Assistant:

void ProfileHandler::GetState(ProfileHandlerState* state) {
  SpinLockHolder cl(&control_lock_);
  {
    ScopedSignalBlocker block(signal_number_);
    SpinLockHolder sl(&signal_lock_);  // Protects interrupts_.
    state->interrupts = interrupts_;
  }
  state->frequency = frequency_;
  state->callback_count = callback_count_;
  state->allowed = allowed_;
}